

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTsim.c
# Opt level: O2

Aig_Tsi_t * Aig_TsiStart(Aig_Man_t *pAig)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  Aig_Tsi_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  Aig_MmFixed_t *pAVar6;
  uint **ppuVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  
  pAVar4 = (Aig_Tsi_t *)calloc(1,0x30);
  pAVar4->pAig = pAig;
  iVar10 = ((pAig->nRegs >> 4) + 1) - (uint)((pAig->nRegs & 0xfU) == 0);
  pAVar4->nWords = iVar10;
  pVVar5 = Vec_PtrAlloc(1000);
  pAVar4->vStates = pVVar5;
  pAVar6 = Aig_MmFixedStart(iVar10 * 4 + 8,10000);
  pAVar4->pMem = pAVar6;
  uVar8 = 499;
  do {
    do {
      uVar1 = uVar8 + 1;
      uVar3 = uVar8 & 1;
      uVar8 = uVar1;
    } while (uVar3 != 0);
    uVar9 = 3;
    do {
      iVar10 = (int)uVar9;
      if (uVar1 < (uint)(iVar10 * iVar10)) {
        pAVar4->nBins = uVar1;
        ppuVar7 = (uint **)calloc(1,(long)(int)uVar1 << 3);
        pAVar4->pBins = ppuVar7;
        return pAVar4;
      }
      uVar2 = (ulong)uVar1 % uVar9;
      uVar9 = (ulong)(iVar10 + 2);
    } while ((int)uVar2 != 0);
  } while( true );
}

Assistant:

Aig_Tsi_t * Aig_TsiStart( Aig_Man_t * pAig )
{
    Aig_Tsi_t * p;
    p = ABC_ALLOC( Aig_Tsi_t, 1 );
    memset( p, 0, sizeof(Aig_Tsi_t) );
    p->pAig    = pAig;
    p->nWords  = Abc_BitWordNum( 2*Aig_ManRegNum(pAig) );
    p->vStates = Vec_PtrAlloc( 1000 );
    p->pMem    = Aig_MmFixedStart( sizeof(unsigned) * p->nWords + sizeof(unsigned *), 10000 );
    p->nBins   = Abc_PrimeCudd(TSI_MAX_ROUNDS/2);
    p->pBins   = ABC_ALLOC( unsigned *, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned *) * p->nBins );
    return p;
}